

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

int __thiscall ModelWriter::estimate_memory_footprint(ModelWriter *this)

{
  int _h;
  int _c;
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  pointer pBVar4;
  int *piVar5;
  bool bVar6;
  char cVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  Extractor ex;
  Mat local_108;
  long local_c0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> outputs;
  MemoryFootprintAllocator allocator;
  
  if (this->has_custom_layer == true) {
    fwrite("model has custom layer, estimate_memory_footprint skipped\n",0x3a,1,_stderr);
    iVar9 = -1;
  }
  else {
    ppLVar1 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    ppLVar2 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_c0 = ((long)(this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0x70;
    MemoryFootprintAllocator::MemoryFootprintAllocator(&allocator);
    ncnn::Net::create_extractor((Net *)&ex);
    ncnn::Extractor::set_light_mode(&ex,true);
    ncnn::Extractor::set_blob_allocator(&ex,&allocator.super_Allocator);
    ncnn::Extractor::set_workspace_allocator(&ex,&allocator.super_Allocator);
    for (lVar10 = 0; (long)ppLVar1 - (long)ppLVar2 >> 3 != lVar10; lVar10 = lVar10 + 1) {
      pLVar3 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar10];
      bVar6 = std::operator==(&pLVar3->type,"ncnnfused");
      if ((!bVar6) && (bVar6 = std::operator!=(&pLVar3->type,"Input"), !bVar6)) {
        iVar9 = *(int *)&pLVar3[1]._vptr_Layer;
        _h = *(int *)((long)&pLVar3[1]._vptr_Layer + 4);
        _c._0_1_ = pLVar3[1].support_bf16_storage;
        _c._1_1_ = pLVar3[1].support_fp16_storage;
        _c._2_1_ = pLVar3[1].support_int8_storage;
        _c._3_1_ = pLVar3[1].support_image_storage;
        bVar12 = iVar9 != 0;
        bVar6 = (_h == 0 && _c == 0) && bVar12;
        bVar13 = _h == 0;
        bVar14 = _c == 0;
        cVar7 = bVar6;
        if (bVar14) {
          cVar7 = '\x02';
        }
        if (bVar13 || !bVar12) {
          cVar7 = bVar6;
        }
        if (!bVar14 && (!bVar13 && bVar12)) {
          cVar7 = '\x03';
        }
        if (cVar7 == '\0') {
          fprintf(_stderr,"Input layer %s without shape info, estimate_memory_footprint skipped\n",
                  (pLVar3->name)._M_dataplus._M_p);
          iVar9 = -1;
          goto LAB_0015b7d0;
        }
        local_108.cstep = 0;
        local_108.data = (Allocator *)0x0;
        local_108.refcount._0_4_ = 0;
        local_108.refcount._4_1_ = false;
        local_108.refcount._5_1_ = false;
        local_108.refcount._6_1_ = false;
        local_108.refcount._7_1_ = false;
        local_108.elemsize._0_1_ = false;
        local_108.elemsize._1_1_ = false;
        local_108.elemsize._2_1_ = false;
        local_108.elemsize._3_1_ = false;
        local_108._20_8_ = 0;
        local_108.h = 0;
        local_108.d = 0;
        local_108.c = 0;
        local_108.allocator = (Allocator *)0x0;
        local_108.dims = 0;
        local_108.w = 0;
        if (cVar7 == '\x03') {
LAB_0015b5af:
          ncnn::Mat::create(&local_108,iVar9,_h,_c,4,&allocator.super_Allocator);
        }
        else if (cVar7 == '\x02') {
          ncnn::Mat::create(&local_108,iVar9,_h,4,&allocator.super_Allocator);
          if (!bVar14 && (!bVar13 && bVar12)) goto LAB_0015b5af;
        }
        else {
          ncnn::Mat::create(&local_108,iVar9,4,&allocator.super_Allocator);
        }
        ncnn::Extractor::input
                  (&ex,*(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,&local_108);
        fprintf(_stderr,"input = %s\n",
                (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start
                [*(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start].name._M_dataplus._M_p);
        piVar5 = (int *)CONCAT44(local_108.refcount._4_4_,(int)local_108.refcount);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              free(local_108.data);
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    outputs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    outputs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    outputs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar10 = 0x24;
    for (lVar11 = 0; local_c0 != lVar11; lVar11 = lVar11 + 1) {
      pBVar4 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)*(int *)((long)pBVar4 + lVar10 + -4);
      if (((lVar8 != -1) && (*(int *)((long)&(pBVar4->name)._M_dataplus._M_p + lVar10) == -1)) &&
         (bVar6 = std::operator==(&(this->layers->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar8]->type,
                                  "ncnnfused"), !bVar6)) {
        local_108.cstep = 0;
        local_108.data = (Allocator *)0x0;
        local_108.refcount._0_4_ = 0;
        local_108.refcount._4_1_ = false;
        local_108.refcount._5_1_ = false;
        local_108.refcount._6_1_ = false;
        local_108.refcount._7_1_ = false;
        local_108.elemsize._0_1_ = false;
        local_108.elemsize._1_1_ = false;
        local_108.elemsize._2_1_ = false;
        local_108.elemsize._3_1_ = false;
        local_108._20_8_ = 0;
        local_108.h = 0;
        local_108.d = 0;
        local_108.c = 0;
        local_108.allocator = (Allocator *)0x0;
        local_108.dims = 0;
        local_108.w = 0;
        ncnn::Extractor::extract(&ex,(int)lVar11,&local_108,0);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back(&outputs,&local_108);
        fprintf(_stderr,"extract = %s\n",*(undefined8 *)((long)pBVar4 + lVar10 + -0x24));
        piVar5 = (int *)CONCAT44(local_108.refcount._4_4_,(int)local_108.refcount);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              free(local_108.data);
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      lVar10 = lVar10 + 0x70;
    }
    fprintf(_stderr,"estimated memory footprint = %.2f KB = %.2f MB\n",
            SUB84((double)((float)allocator.memory_footprint * 0.0009765625),0),
            (double)((float)allocator.memory_footprint * 0.0009765625 * 0.0009765625));
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&outputs);
    iVar9 = 0;
LAB_0015b7d0:
    ncnn::Extractor::~Extractor(&ex);
    MemoryFootprintAllocator::~MemoryFootprintAllocator(&allocator);
  }
  return iVar9;
}

Assistant:

int ModelWriter::estimate_memory_footprint()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, estimate_memory_footprint skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    MemoryFootprintAllocator allocator;

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    ex.set_blob_allocator(&allocator);
    ex.set_workspace_allocator(&allocator);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, estimate_memory_footprint skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w, 4u, &allocator);
        if (dims == 2) m.create(w, h, 4u, &allocator);
        if (dims == 3) m.create(w, h, c, 4u, &allocator);

        ex.input(layer->tops[0], m);

        fprintf(stderr, "input = %s\n", blobs[layer->tops[0]].name.c_str());
    }

    // find output blobs and do inference
    std::vector<ncnn::Mat> outputs;
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        if (blob.producer == -1 || blob.consumer != -1)
            continue;

        if (layers[blob.producer]->type == "ncnnfused")
            continue;

        // treat blob without any consumers as output
        ncnn::Mat m;
        ex.extract(int(i), m);
        outputs.push_back(m);

        fprintf(stderr, "extract = %s\n", blob.name.c_str());
    }

    fprintf(stderr, "estimated memory footprint = %.2f KB = %.2f MB\n", allocator.memory_footprint / 1024.f, allocator.memory_footprint / 1024.f / 1024.f);

    return 0;
}